

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_allocator.cpp
# Opt level: O2

IndexPointer __thiscall
duckdb::FixedSizeAllocator::VacuumPointer(FixedSizeAllocator *this,IndexPointer ptr)

{
  IndexPointer ptr_00;
  data_ptr_t __dest;
  data_ptr_t __src;
  
  ptr_00 = New(this);
  this->total_segment_count = this->total_segment_count - 1;
  __dest = Get(this,ptr_00,true);
  __src = Get(this,ptr,true);
  switchD_016b0717::default(__dest,__src,this->segment_size);
  return (IndexPointer)ptr_00.data;
}

Assistant:

IndexPointer FixedSizeAllocator::VacuumPointer(const IndexPointer ptr) {
	// we do not need to adjust the bitmask of the old buffer, because we will free the entire
	// buffer after the vacuum operation

	auto new_ptr = New();
	// new increases the allocation count, we need to counter that here
	total_segment_count--;

	memcpy(Get(new_ptr), Get(ptr), segment_size);
	return new_ptr;
}